

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O0

void __thiscall cmStateSnapshot::PushPolicy(cmStateSnapshot *this,PolicyMap *entry,bool weak)

{
  cmState *pcVar1;
  PolicyStackEntry t;
  iterator it;
  PointerType pSVar2;
  PolicyStackEntry local_80;
  cmLinkedTree<cmStateDetail::PolicyStackEntry> *local_50;
  PositionType local_48;
  iterator local_40;
  undefined1 local_30 [8];
  PositionType pos;
  bool weak_local;
  PolicyMap *entry_local;
  cmStateSnapshot *this_local;
  
  local_30 = (undefined1  [8])(this->Position).Tree;
  pos.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(this->Position).Position;
  pcVar1 = this->State;
  pos.Position._7_1_ = weak;
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_30)
  ;
  local_50 = (pSVar2->Policies).Tree;
  local_48 = (pSVar2->Policies).Position;
  cmStateDetail::PolicyStackEntry::PolicyStackEntry(&local_80,entry,(bool)(pos.Position._7_1_ & 1));
  it.Position = local_48;
  it.Tree = local_50;
  t.super_PolicyMap.Status.super__Base_bitset<5UL>._M_w[1] =
       local_80.super_PolicyMap.Status.super__Base_bitset<5UL>._M_w[1];
  t.super_PolicyMap.Status.super__Base_bitset<5UL>._M_w[0] =
       local_80.super_PolicyMap.Status.super__Base_bitset<5UL>._M_w[0];
  t.super_PolicyMap.Status.super__Base_bitset<5UL>._M_w[2] =
       local_80.super_PolicyMap.Status.super__Base_bitset<5UL>._M_w[2];
  t.super_PolicyMap.Status.super__Base_bitset<5UL>._M_w[3] =
       local_80.super_PolicyMap.Status.super__Base_bitset<5UL>._M_w[3];
  t.super_PolicyMap.Status.super__Base_bitset<5UL>._M_w[4] =
       local_80.super_PolicyMap.Status.super__Base_bitset<5UL>._M_w[4];
  t.Weak = local_80.Weak;
  t._41_7_ = local_80._41_7_;
  local_40 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::Push(&pcVar1->PolicyStack,it,t);
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_30)
  ;
  (pSVar2->Policies).Tree = local_40.Tree;
  (pSVar2->Policies).Position = local_40.Position;
  return;
}

Assistant:

void cmStateSnapshot::PushPolicy(cmPolicies::PolicyMap const& entry, bool weak)
{
  cmStateDetail::PositionType pos = this->Position;
  pos->Policies = this->State->PolicyStack.Push(
    pos->Policies, cmStateDetail::PolicyStackEntry(entry, weak));
}